

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O0

aiExportDataBlob * aiExportSceneToBlob(aiScene *pScene,char *pFormatId,uint pPreprocessing)

{
  aiExportDataBlob *paVar1;
  aiExportDataBlob *blob;
  Exporter local_30;
  Exporter exp;
  uint pPreprocessing_local;
  char *pFormatId_local;
  aiScene *pScene_local;
  
  exp.pimpl._4_4_ = pPreprocessing;
  Assimp::Exporter::Exporter(&local_30);
  paVar1 = Assimp::Exporter::ExportToBlob
                     (&local_30,pScene,pFormatId,exp.pimpl._4_4_,(ExportProperties *)0x0);
  if (paVar1 == (aiExportDataBlob *)0x0) {
    pScene_local = (aiScene *)0x0;
  }
  else {
    pScene_local = (aiScene *)Assimp::Exporter::GetOrphanedBlob(&local_30);
    if ((aiExportDataBlob *)pScene_local == (aiExportDataBlob *)0x0) {
      __assert_fail("blob",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/CApi/AssimpCExport.cpp"
                    ,0x91,
                    "const aiExportDataBlob *aiExportSceneToBlob(const aiScene *, const char *, unsigned int)"
                   );
    }
  }
  Assimp::Exporter::~Exporter(&local_30);
  return (aiExportDataBlob *)pScene_local;
}

Assistant:

ASSIMP_API const C_STRUCT aiExportDataBlob* aiExportSceneToBlob( const aiScene* pScene, const char* pFormatId, unsigned int pPreprocessing  )
{
    Exporter exp;
    if (!exp.ExportToBlob(pScene,pFormatId,pPreprocessing)) {
        return NULL;
    }
    const aiExportDataBlob* blob = exp.GetOrphanedBlob();
    ai_assert(blob);

    return blob;
}